

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestsList
               (ostream *stream,
               vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *test_cases)

{
  ostream *poVar1;
  size_type sVar2;
  vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *in_RSI;
  ostream *in_RDI;
  size_t i_1;
  size_t i;
  int total_tests;
  string kTestsuites;
  TestCase *in_stack_000001d8;
  ostream *in_stack_000001e0;
  int *in_stack_fffffffffffffed8;
  ulong local_f0;
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [32];
  string local_98 [32];
  string *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  ostream *in_stack_ffffffffffffffa0;
  ulong local_50;
  allocator local_31;
  string local_30 [32];
  vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"testsuites",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::operator<<(local_8,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  poVar1 = std::operator<<(local_8,"<");
  std::operator<<(poVar1,local_30);
  local_50 = 0;
  while( true ) {
    sVar2 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size(local_10);
    if (sVar2 <= local_50) break;
    std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
              (local_10,local_50);
    TestCase::total_test_count((TestCase *)0x16d6c5);
    local_50 = local_50 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff90,"tests",(allocator *)&stack0xffffffffffffff8f);
  StreamableToString<int>(in_stack_fffffffffffffed8);
  OutputXmlAttribute(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"name",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"AllTests",&local_e1);
  OutputXmlAttribute(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::operator<<(local_8,">\n");
  local_f0 = 0;
  while( true ) {
    sVar2 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size(local_10);
    if (sVar2 <= local_f0) break;
    std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
              (local_10,local_f0);
    PrintXmlTestCase(in_stack_000001e0,in_stack_000001d8);
    local_f0 = local_f0 + 1;
  }
  poVar1 = std::operator<<(local_8,"</");
  poVar1 = std::operator<<(poVar1,local_30);
  std::operator<<(poVar1,">\n");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestsList(
    std::ostream* stream, const std::vector<TestCase*>& test_cases) {
  const std::string kTestsuites = "testsuites";

  *stream << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
  *stream << "<" << kTestsuites;

  int total_tests = 0;
  for (size_t i = 0; i < test_cases.size(); ++i) {
    total_tests += test_cases[i]->total_test_count();
  }
  OutputXmlAttribute(stream, kTestsuites, "tests",
                     StreamableToString(total_tests));
  OutputXmlAttribute(stream, kTestsuites, "name", "AllTests");
  *stream << ">\n";

  for (size_t i = 0; i < test_cases.size(); ++i) {
    PrintXmlTestCase(stream, *test_cases[i]);
  }
  *stream << "</" << kTestsuites << ">\n";
}